

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v8::detail::fill_n<fmt::v8::appender,unsigned_long,char>
                   (appender out,unsigned_long count,char *value)

{
  char cVar1;
  long lVar2;
  
  if (count != 0) {
    do {
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                    + 0x18) <
          *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                   0x10) + 1U) {
        (*(code *)**(undefined8 **)
                    out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                  (out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
      }
      cVar1 = *value;
      lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                              container + 0x10);
      *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
               0x10) = lVar2 + 1;
      *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                container + 8) + lVar2) = cVar1;
      count = count - 1;
    } while (count != 0);
  }
  return (appender)
         out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR auto fill_n(OutputIt out, Size count, const T& value)
    -> OutputIt {
  for (Size i = 0; i < count; ++i) *out++ = value;
  return out;
}